

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cc
# Opt level: O0

double __thiscall
calculator::ExpressionTree::calcBinaryFunctionValuie
          (ExpressionTree *this,node *x,node *y,string *function)

{
  bool bVar1;
  BinaryFunctionException *this_00;
  pointer ppVar2;
  FunctionDeclareException *this_01;
  double dVar3;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double,_double)>_>,_true>
  local_48;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double,_double)>_>,_true>
  local_40;
  iterator it;
  string *function_local;
  node *y_local;
  node *x_local;
  ExpressionTree *this_local;
  
  if ((y != (node *)0x0) && (x != (node *)0x0)) {
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double,_double)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double,_double)>_>_>_>
         ::find(&(this->lexer_).binary_functions,function);
    local_48._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double,_double)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double,_double)>_>_>_>
         ::end(&(this->lexer_).binary_functions);
    bVar1 = std::__detail::operator!=(&local_40,&local_48);
    if (!bVar1) {
      this_01 = (FunctionDeclareException *)__cxa_allocate_exception(0x28);
      FunctionDeclareException::FunctionDeclareException(this_01,function);
      __cxa_throw(this_01,&FunctionDeclareException::typeinfo,
                  FunctionDeclareException::~FunctionDeclareException);
    }
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double,_double)>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double,_double)>_>,_false,_true>
                           *)&local_40);
    dVar3 = std::function<double_(double,_double)>::operator()(&ppVar2->second,x->value,y->value);
    return dVar3;
  }
  this_00 = (BinaryFunctionException *)__cxa_allocate_exception(0x28);
  BinaryFunctionException::BinaryFunctionException(this_00,function);
  __cxa_throw(this_00,&BinaryFunctionException::typeinfo,
              BinaryFunctionException::~BinaryFunctionException);
}

Assistant:

double ExpressionTree::calcBinaryFunctionValuie(node *x, node *y,
                                                std::string function) {
    if (y == nullptr || x == nullptr) throw BinaryFunctionException(function);
    if (auto it = lexer_.binary_functions.find(function);
        it != lexer_.binary_functions.end()) {
        return it->second(x->value, y->value);
    }
    throw FunctionDeclareException(function);
}